

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

ssize_t libssh2_sftp_write(LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t count)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  ssize_t rc;
  size_t count_local;
  char *buffer_local;
  LIBSSH2_SFTP_HANDLE *hnd_local;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    hnd_local = (LIBSSH2_SFTP_HANDLE *)0xffffffffffffffd9;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      entry_time = sftp_write(hnd,buffer,count);
      if (((entry_time != -0x25) || (hnd->sftp->channel->session == (LIBSSH2_SESSION *)0x0)) ||
         (hnd->sftp->channel->session->api_block_mode == 0)) break;
      iVar1 = _libssh2_wait_socket(hnd->sftp->channel->session,start_time);
      entry_time = (time_t)iVar1;
    } while (entry_time == 0);
    hnd_local = (LIBSSH2_SFTP_HANDLE *)entry_time;
  }
  return (ssize_t)hnd_local;
}

Assistant:

LIBSSH2_API ssize_t
libssh2_sftp_write(LIBSSH2_SFTP_HANDLE *hnd, const char *buffer,
                   size_t count)
{
    ssize_t rc;
    if(!hnd)
        return LIBSSH2_ERROR_BAD_USE;
    BLOCK_ADJUST(rc, hnd->sftp->channel->session,
                 sftp_write(hnd, buffer, count));
    return rc;

}